

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lesson.h
# Opt level: O2

void __thiscall
Lesson::Lesson(Lesson *this,size_t i,string *data,
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>_>
              *preps_map)

{
  string *__lhs;
  bool bVar1;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  long lVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  raw_data;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  time_splits;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  raw_preps;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  Professor realPrep;
  
  (this->subject)._M_dataplus._M_p = (pointer)&(this->subject).field_2;
  (this->subject)._M_string_length = 0;
  (this->subject).field_2._M_local_buf[0] = '\0';
  (this->room)._M_dataplus._M_p = (pointer)&(this->room).field_2;
  (this->room)._M_string_length = 0;
  __lhs = &this->subject;
  (this->room).field_2._M_local_buf[0] = '\0';
  (this->professor)._M_dataplus._M_p = (pointer)&(this->professor).field_2;
  (this->professor)._M_string_length = 0;
  (this->professor).field_2._M_local_buf[0] = '\0';
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->time)._M_dataplus._M_p = (pointer)&(this->time).field_2;
  (this->time)._M_string_length = 0;
  (this->time).field_2._M_local_buf[0] = '\0';
  time_splits._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &time_splits._M_t._M_impl.super__Rb_tree_header._M_header;
  time_splits._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  time_splits._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  time_splits._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  realPrep.prep_id = 0;
  time_splits._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       time_splits._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&time_splits,&realPrep.prep_id);
  std::__cxx11::string::assign((char *)pmVar3);
  realPrep.prep_id = 1;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&time_splits,&realPrep.prep_id);
  std::__cxx11::string::assign((char *)pmVar3);
  realPrep.prep_id = 2;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&time_splits,&realPrep.prep_id);
  std::__cxx11::string::assign((char *)pmVar3);
  realPrep.prep_id = 3;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&time_splits,&realPrep.prep_id);
  std::__cxx11::string::assign((char *)pmVar3);
  realPrep.prep_id = 4;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&time_splits,&realPrep.prep_id);
  std::__cxx11::string::assign((char *)pmVar3);
  realPrep.prep_id = 5;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&time_splits,&realPrep.prep_id);
  std::__cxx11::string::assign((char *)pmVar3);
  realPrep.prep_id = 6;
  pmVar3 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&time_splits,&realPrep.prep_id);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::string((string *)&local_100,(string *)data);
  std::__cxx11::string::string((string *)&local_120,"#",(allocator *)&realPrep);
  split(&raw_data,&local_100,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  this->lesson_id = i;
  this->exist = false;
  bVar1 = std::operator!=(raw_data.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"");
  if (!bVar1) goto LAB_00117ed3;
  this->exist = true;
  this->moveable = true;
  std::__cxx11::string::_M_assign((string *)__lhs);
  std::__cxx11::string::_M_assign((string *)&this->professor);
  std::__cxx11::string::_M_assign((string *)&this->room);
  realPrep.prep_id = (int)(i % 7);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&time_splits,&realPrep.prep_id);
  std::__cxx11::string::_M_assign((string *)&this->time);
  bVar1 = std::operator==(__lhs,anon_var_dwarf_18da7);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(__lhs,anon_var_dwarf_18dc0);
    if (!bVar1) {
      bVar1 = std::operator==(__lhs,anon_var_dwarf_18dd9);
      if (!bVar1) {
        bVar2 = std::operator==(__lhs,anon_var_dwarf_18df2);
      }
    }
  }
  this->doubled = bVar2;
  bVar1 = std::operator==(__lhs,anon_var_dwarf_18dd9);
  if (bVar1) {
LAB_00117e16:
    this->moveable = false;
  }
  else {
    bVar1 = std::operator==(__lhs,anon_var_dwarf_18e0b);
    if (bVar1) goto LAB_00117e16;
    bVar1 = std::operator==(__lhs,anon_var_dwarf_18e24);
    if (bVar1) goto LAB_00117e16;
    bVar1 = std::operator==(__lhs,anon_var_dwarf_18e3d);
    if (bVar1) goto LAB_00117e16;
    bVar1 = std::operator==(__lhs,anon_var_dwarf_18e56);
    if (bVar1) goto LAB_00117e16;
    bVar1 = std::operator==(__lhs,anon_var_dwarf_18df2);
    if (bVar1) goto LAB_00117e16;
  }
  std::__cxx11::string::string((string *)&local_140,(string *)&this->professor);
  std::__cxx11::string::string((string *)&local_160,"_",(allocator *)&realPrep);
  split(&raw_preps,&local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  lVar6 = 0;
  for (uVar5 = 0;
      uVar5 < (ulong)((long)raw_preps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)raw_preps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar5 = uVar5 + 1) {
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Professor>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)preps_map,
                          (key_type *)
                          ((long)&((raw_preps.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar6));
    Professor::Professor(&realPrep,pmVar4);
    std::vector<Professor,_std::allocator<Professor>_>::push_back(&this->prep_list,&realPrep);
    Professor::~Professor(&realPrep);
    lVar6 = lVar6 + 0x20;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&raw_preps);
LAB_00117ed3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&raw_data);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&time_splits._M_t);
  return;
}

Assistant:

Lesson(size_t i, std::string data, std::unordered_map <std::string, Professor> preps_map) {

        std::map< int, std::string > time_splits;
        time_splits[0] = "9:00-10:25";
        time_splits[1] = "10:45-12:10";
        time_splits[2] = "12:20-13:45";
        time_splits[3] = "13:55-15:20";
        time_splits[4] = "15:30-16:55";
        time_splits[5] = "17:05-18:30";
        time_splits[6] = "18:35-20:00";
        //std::cout << "data " << data << std::endl;
        std::vector <std::string> raw_data = split(data, "#");
        lesson_id = i;
        exist = false;
        if (raw_data[0] != "") {

            exist = true;
            //std::cout << raw_data[0] << " " << raw_data[1] << " " <<raw_data[2] << " " << raw_data[3] << std::endl;
            moveable = true;
            subject = raw_data[0];
            professor = raw_data[1];
            room = raw_data[2];
            time = time_splits[i%7];
            if((subject == "Компьютерные технологии") || (subject == "Общая физика: лаб.практикум") || (subject == "Доп. главы дискретного анализа") || (subject== "Современные проблемы прикладной математики") ) {
                doubled = true;
            }
            else {
                doubled = false;
            }

            if ((subject == "Доп. главы дискретного анализа") || ((subject == "Дифференциальные уравнения"))
            || (subject == "Гармонический анализ") || (subject == "Мера и интеграл Лебега") || (subject == "Ин.яз.") || (subject == "Современные проблемы прикладной математики")) {
               moveable = false;
            }

            std::vector <std::string> raw_preps = split(professor, "_");
            for(size_t i = 0; i < raw_preps.size(); i++) {

                Professor realPrep = Professor(preps_map[raw_preps[i]]);
                prep_list.push_back(realPrep);
            }
        }

    }